

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_cell_id_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_INT cell_id,REF_LONG ncell_expected,REF_GLOB *l2c
          ,REF_BOOL binary,FILE *file)

{
  REF_MPI ref_mpi_00;
  REF_STATUS RVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int int_node;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ncell_actual;
  int local_1c8;
  REF_INT ncell;
  REF_INT part;
  REF_INT proc;
  REF_INT *int_c2n;
  REF_GLOB *c2n;
  REF_INT node_per;
  REF_GLOB globals [27];
  REF_INT local_c8 [2];
  REF_INT nodes [27];
  int local_50;
  int local_4c;
  REF_INT node;
  REF_INT cell;
  REF_MPI ref_mpi;
  REF_BOOL binary_local;
  REF_GLOB *l2c_local;
  REF_LONG ncell_expected_local;
  REF_INT cell_id_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  ref_mpi_00 = ref_node->ref_mpi;
  c2n._4_4_ = ref_cell->node_per;
  _int_node = 0;
  if (ref_mpi_00->id == 0) {
    for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_4c,local_c8);
      if ((RVar1 == 0) && (cell_id == local_c8[ref_cell->node_per])) {
        ref_private_status_reis_ai._4_4_ = ref_cell_part(ref_cell,ref_node,local_4c,&local_1c8);
        if (ref_private_status_reis_ai._4_4_ != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x28c,"ref_gather_cell_id_tec",(ulong)ref_private_status_reis_ai._4_4_,"part");
          return ref_private_status_reis_ai._4_4_;
        }
        ref_private_status_reis_ai._4_4_ = 0;
        if (ref_mpi_00->id == local_1c8) {
          for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
            globals[(long)local_50 + -1] = l2c[local_c8[local_50]];
          }
          if (binary == 0) {
            for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
              globals[(long)local_50 + -1] = globals[(long)local_50 + -1] + 1;
              fprintf((FILE *)file," %ld",globals[(long)local_50 + -1]);
            }
            fprintf((FILE *)file,"\n");
          }
          else {
            for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
              ref_private_status_reis_ai._0_4_ = (undefined4)globals[(long)local_50 + -1];
              sVar4 = fwrite(&ref_private_status_reis_ai,4,1,(FILE *)file);
              if (sVar4 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x295,"ref_gather_cell_id_tec","int c2n",1,sVar4);
                return 1;
              }
            }
          }
          _int_node = _int_node + 1;
        }
      }
    }
  }
  if (ref_mpi_00->id == 0) {
    for (ncell = 1; ncell < ref_mpi_00->n; ncell = ncell + 1) {
      uVar2 = ref_mpi_gather_recv(ref_mpi_00,(void *)((long)&ncell_actual + 4),1,1,ncell);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x2a7,"ref_gather_cell_id_tec",(ulong)uVar2,"recv ncell");
        return uVar2;
      }
      if (ncell_actual._4_4_ * c2n._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x2a8,"ref_gather_cell_id_tec","malloc c2n of REF_GLOB negative");
        return 1;
      }
      int_c2n = (REF_INT *)malloc((long)(ncell_actual._4_4_ * c2n._4_4_) << 3);
      if (int_c2n == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x2a8,"ref_gather_cell_id_tec","malloc c2n of REF_GLOB NULL");
        return 2;
      }
      if (ncell_actual._4_4_ * c2n._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x2a9,"ref_gather_cell_id_tec","malloc int_c2n of REF_INT negative");
        return 1;
      }
      _part = malloc((long)(ncell_actual._4_4_ * c2n._4_4_) << 2);
      if (_part == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x2a9,"ref_gather_cell_id_tec","malloc int_c2n of REF_INT NULL");
        return 2;
      }
      uVar2 = ref_mpi_gather_recv(ref_mpi_00,int_c2n,ncell_actual._4_4_ * c2n._4_4_,2,ncell);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x2ac,"ref_gather_cell_id_tec",(ulong)uVar2,"recv c2n");
        return uVar2;
      }
      if (binary == 0) {
        for (local_4c = 0; local_4c < ncell_actual._4_4_ * c2n._4_4_; local_4c = local_4c + 1) {
          *(long *)(int_c2n + (long)local_4c * 2) = *(long *)(int_c2n + (long)local_4c * 2) + 1;
        }
        for (local_4c = 0; local_4c < ncell_actual._4_4_; local_4c = local_4c + 1) {
          for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
            fprintf((FILE *)file," %ld",
                    *(undefined8 *)(int_c2n + (long)(local_50 + c2n._4_4_ * local_4c) * 2));
          }
          fprintf((FILE *)file,"\n");
        }
      }
      else {
        for (local_4c = 0; local_4c < ncell_actual._4_4_ * c2n._4_4_; local_4c = local_4c + 1) {
          *(int *)((long)_part + (long)local_4c * 4) =
               (int)*(undefined8 *)(int_c2n + (long)local_4c * 2);
        }
        iVar3 = ncell_actual._4_4_ * c2n._4_4_;
        sVar4 = fwrite(_part,4,(long)(ncell_actual._4_4_ * c2n._4_4_),(FILE *)file);
        if ((long)iVar3 != sVar4) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x2b4,"ref_gather_cell_id_tec","int c2n",(long)iVar3,sVar4);
          return 1;
        }
      }
      _int_node = ncell_actual._4_4_ + _int_node;
      if (_part != (void *)0x0) {
        free(_part);
      }
      if (int_c2n != (REF_INT *)0x0) {
        free(int_c2n);
      }
    }
  }
  else {
    ncell_actual._4_4_ = 0;
    for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_4c,local_c8);
      if ((RVar1 == 0) && (cell_id == local_c8[ref_cell->node_per])) {
        uVar2 = ref_cell_part(ref_cell,ref_node,local_4c,&local_1c8);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x2c9,"ref_gather_cell_id_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi_00->id == local_1c8) {
          ncell_actual._4_4_ = ncell_actual._4_4_ + 1;
        }
      }
    }
    uVar2 = ref_mpi_gather_send(ref_mpi_00,(void *)((long)&ncell_actual + 4),1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x2cd,"ref_gather_cell_id_tec",(ulong)uVar2,"send ncell");
      return uVar2;
    }
    if (ncell_actual._4_4_ * c2n._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x2ce,"ref_gather_cell_id_tec","malloc c2n of REF_GLOB negative");
      return 1;
    }
    int_c2n = (REF_INT *)malloc((long)(ncell_actual._4_4_ * c2n._4_4_) << 3);
    if (int_c2n == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x2ce,"ref_gather_cell_id_tec","malloc c2n of REF_GLOB NULL");
      return 2;
    }
    ncell_actual._4_4_ = 0;
    for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_4c,local_c8);
      if ((RVar1 == 0) && (cell_id == local_c8[ref_cell->node_per])) {
        uVar2 = ref_cell_part(ref_cell,ref_node,local_4c,&local_1c8);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x2d2,"ref_gather_cell_id_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi_00->id == local_1c8) {
          for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
            *(REF_GLOB *)(int_c2n + (long)(local_50 + c2n._4_4_ * ncell_actual._4_4_) * 2) =
                 l2c[local_c8[local_50]];
          }
          ncell_actual._4_4_ = ncell_actual._4_4_ + 1;
        }
      }
    }
    uVar2 = ref_mpi_gather_send(ref_mpi_00,int_c2n,ncell_actual._4_4_ * c2n._4_4_,2);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x2db,"ref_gather_cell_id_tec",(ulong)uVar2,"send c2n");
      return uVar2;
    }
    if (int_c2n != (REF_INT *)0x0) {
      free(int_c2n);
    }
  }
  if ((ref_mpi_00->id == 0) && (ncell_expected != _int_node)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x2e1,
           "ref_gather_cell_id_tec","cell count mismatch",ncell_expected,_int_node);
    ref_node_local._4_4_ = 1;
  }
  else {
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_id_tec(
    REF_NODE ref_node, REF_CELL ref_cell, REF_INT cell_id,
    REF_LONG ncell_expected, REF_GLOB *l2c, REF_BOOL binary, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT *int_c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (node = 0; node < node_per; node++) {
            globals[node] = l2c[nodes[node]];
          }
          if (binary) {
            for (node = 0; node < node_per; node++) {
              int int_node;
              int_node = (int)globals[node]; /* binary zero-based */
              REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
            }
          } else {
            for (node = 0; node < node_per; node++) {
              globals[node]++; /* ascii one-based */
              fprintf(file, " " REF_GLOB_FMT, globals[node]);
            }
            fprintf(file, "\n");
          }
          ncell_actual++;
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      ref_malloc(int_c2n, ncell * node_per, REF_INT);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");

      if (binary) { /* binary 0-based int, ASCII 1-based */
        for (cell = 0; cell < ncell * node_per; cell++) {
          int_c2n[cell] = (REF_INT)c2n[cell];
        }
        REIS(ncell * node_per,
             fwrite(int_c2n, sizeof(int), (size_t)(ncell * node_per), file),
             "int c2n");
      } else {
        for (cell = 0; cell < ncell * node_per; cell++) {
          c2n[cell]++;
        }
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++) {
            fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
          }
          fprintf(file, "\n");
        }
      }
      ncell_actual += ncell;

      ref_free(int_c2n);
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (node = 0; node < node_per; node++)
            c2n[node + node_per * ncell] = l2c[nodes[node]];
          ncell++;
        }
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}